

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

string * __thiscall CJSON::EscapeString(string *__return_storage_ptr__,CJSON *this,string *str)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  uint uVar5;
  char cVar6;
  string *psVar7;
  long lVar8;
  long lVar9;
  string *psVar10;
  byte abStack_228 [126];
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  uint8_t Buf [4];
  string local_188;
  string Encode;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\\",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\\\",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_50,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\"",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\\"",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_70,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"/",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\/",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_90,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\b",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\b",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_b0,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\n",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\n",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_d0,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\f",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\f",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_f0,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\r",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\r",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_110,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"\t",(allocator<char> *)(abStack_228 + 0x7f));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)Buf,"\\t",(allocator<char> *)(abStack_228 + 0x7e));
  ReplaceAll(&Encode,this,&local_130,&local_188,(string *)Buf);
  std::__cxx11::string::operator=((string *)str,(string *)&Encode);
  std::__cxx11::string::~string((string *)&Encode);
  std::__cxx11::string::~string((string *)Buf);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_130);
  psVar7 = (string *)0x0;
  do {
    if ((string *)str->_M_string_length <= psVar7) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
      return __return_storage_ptr__;
    }
    iVar2 = IsUTF8(this,(uchar)psVar7[(long)(str->_M_dataplus)._M_p]);
    if (iVar2 != 0) {
      iVar3 = UTF8BitShift(this,(uchar)psVar7[(long)(str->_M_dataplus)._M_p]);
      Buf[0] = '\0';
      Buf[1] = '\0';
      Buf[2] = '\0';
      Buf[3] = '\0';
      pcVar4 = (str->_M_dataplus)._M_p;
      lVar8 = (long)iVar2;
      Buf[lVar8] = (byte)(0xff >> ((byte)iVar3 & 0x1f)) & (byte)psVar7[(long)pcVar4];
      lVar9 = lVar8;
      psVar10 = psVar7;
      while( true ) {
        psVar10 = psVar10 + 1;
        if (lVar9 == 0) break;
        if (((string *)str->_M_string_length <= psVar10) ||
           (iVar3 = UTF8BitShift(this,(uchar)psVar10[(long)pcVar4]), iVar3 != 2)) {
          if (lVar9 != 0) goto LAB_001229c4;
          break;
        }
        pcVar4 = (str->_M_dataplus)._M_p;
        abStack_228[lVar9 + 0x7f] = (byte)psVar10[(long)pcVar4] & 0x3f;
        lVar9 = lVar9 + -1;
      }
      uVar5 = 0;
      bVar1 = 6;
      for (cVar6 = '\0'; iVar3 = (int)cVar6, iVar3 < iVar2; cVar6 = cVar6 + '\x01') {
        uVar5 = uVar5 | ((uint)((char)(4 << (cVar6 * '\x02' & 0x1fU)) - 1U & Buf[(long)iVar3 + 1])
                         << (bVar1 & 0x1f) | (uint)Buf[iVar3]) << (cVar6 * '\b' & 0x1fU);
        Buf[(long)iVar3 + 1] = Buf[(long)iVar3 + 1] >> (cVar6 * '\x02' + 2U & 0x1f);
        bVar1 = bVar1 - 2;
      }
      NumToHexStr_abi_cxx11_
                (&local_188,this,(uint)Buf[lVar8] << ((char)iVar2 * '\b' & 0x1fU) | uVar5);
      std::operator+(&Encode,"\\u",&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::erase((ulong)str,(ulong)psVar7);
      std::__cxx11::string::insert((ulong)str,psVar7);
      psVar7 = psVar7 + (Encode._M_string_length - 1);
      std::__cxx11::string::~string((string *)&Encode);
    }
LAB_001229c4:
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

inline std::string EscapeString(std::string str)
        {
            str = ReplaceAll(str, "\\", "\\\\");
            str = ReplaceAll(str, "\"", "\\\"");
            str = ReplaceAll(str, "/", "\\/");
            str = ReplaceAll(str, "\b", "\\b");
            str = ReplaceAll(str, "\n", "\\n");
            str = ReplaceAll(str, "\f", "\\f");
            str = ReplaceAll(str, "\r", "\\r");
            str = ReplaceAll(str, "\t", "\\t");

            //UTF-8 decoding.
            for(size_t i = 0; i < str.size(); i++)
            {
                int Bytes = IsUTF8(str[i]);
                if(Bytes)
                {
                    int FreeBits = UTF8BitShift(str[i]);
                    uint8_t Buf[sizeof(uint32_t)] = {0};
                    Buf[Bytes] = str[i] & (0xFF >> FreeBits);

                    size_t Counter = 0;

                    for (; Counter < Bytes; Counter++)
                    {
                        size_t Pos = i + Counter + 1;
                        if(Pos >= str.size())   //End of string?
                            break;

                        int ShiftBits = UTF8BitShift(str[Pos]);
                        if(ShiftBits != 2)  //All second Bytes needs to begin with 10xxxxxx, otherwise its not utf-8.
                            break;

                        uint8_t c = str[Pos] & (0xFF >> ShiftBits);
                        Buf[Bytes - (Counter + 1)] = c;
                    }

                    //We have valid UTF8
                    if(Counter == Bytes)
                    {
                        uint32_t UTF32 = 0;
                        uint8_t Shift = 6;

                        for(char i = 0; i < Bytes; i++)
                        {
                            //ä - xxx00011 xx100100
                            //𝄞 - xxxxx000 xx011101 xx000100 xx011110

                            //1 - << 6
                            //ä - xxx000xx 11100100
                            //xxx000xx >> 2 - xxxxx000 11100100
                            //End



                            //1 - << 6
                            //𝄞 - xxxxx000 xx011101 xx0001xx 00011110
                            //xx0001xx >> 2 - xxxxx000 xx011101 xxxx0001 00011110

                            //2 - << 4
                            //𝄞 - xxxxx000 xx01xxxx 11010001 00011110
                            //xx01xxxx >> 4 - xxxxx000 xxxxxx01 11010001 00011110

                            //3 - << 2
                            //𝄞 - xxxxxxxx xxx00001 11010001 00011110
                            //End

                            //i = xx100100

                            uint8_t Carry = (Buf[i + 1] & ((0x4 << i * 2) - 1));
        
                            UTF32 |= (Buf[i] | (Carry << Shift)) << (8 * i);
                            Buf[i + 1] >>= i * 2 + 2;

                            Shift -= 2;

                            // UTF32 |= (Buf[i] | ((Buf[i + 1] & ((0x4 << i * 2) - 1)) << ((Bytes + 1 - i) * 2))) << (8 * i);
                            // Buf[i + 1] >>= i * 2 + 2;
                        }

                        UTF32 |= Buf[Bytes] << (8 * Bytes);

                        std::string Encode = "\\u" + NumToHexStr(UTF32);
                        str.erase(i, Bytes + 1);
                        str.insert(i, Encode);
                        i += Encode.size() - 1;
                    }
                }
            }

            return str;
        }